

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::BlurEffect::drawBlur(BlurEffect *this,QPainter *p,QColor *c)

{
  Orientation OVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QRect dark;
  QColor c1;
  QBrush local_50 [8];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  QColor local_38;
  
  lVar2 = *(long *)&this->field_0x20;
  iVar4 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  iVar3 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_38._0_8_ = *(undefined8 *)c;
  local_38._8_8_ = *(undefined8 *)((long)&c->ct + 4);
  QColor::setAlpha((int)&local_38);
  OVar1 = this->orientation;
  local_44 = 0;
  local_48 = 0;
  if (OVar1 == Vertical) {
    local_48 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + -2;
  }
  if (OVar1 == Horizontal) {
    local_44 = ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + -2;
    iVar3 = 3;
  }
  if (OVar1 == Vertical) {
    iVar4 = 3;
  }
  local_40 = iVar4 + local_48;
  local_3c = iVar3 + local_44;
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_50,&local_38,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_50);
  QPainter::drawEllipse((QRect *)p);
  return;
}

Assistant:

void
BlurEffect::drawBlur( QPainter * p, const QColor & c )
{
	const QRect r = rect();

	const qreal realPressure = qMin(
		(qreal) qAbs( pressure ) / maxPressure, 1.0 );

	QColor c1 = c;
	c1.setAlpha( 255 * realPressure );

	const QRect dark(
		( orientation == Qt::Vertical ? r.x() + r.width() / 2 - 2 : r.x() ),
		( orientation == Qt::Horizontal ? r.y() + r.height() / 2 - 2 : r.y() ),
		( orientation == Qt::Vertical ? 4 : r.width() ),
		( orientation == Qt::Horizontal ? 4 : r.height() ) );

	p->setPen( Qt::NoPen );
	p->setBrush( c1 );
	p->drawEllipse( dark );
}